

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayPtr<const_unsigned_char> *
kj::_::HeapArrayDisposer::allocate<kj::ArrayPtr<unsigned_char_const>>(size_t count)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t count_local;
  
  pAVar1 = (ArrayPtr<const_unsigned_char> *)
           allocateImpl(0x10,count,count,Allocate_<kj::ArrayPtr<const_unsigned_char>_>::construct,
                        ArrayDisposer::Dispose_<kj::ArrayPtr<const_unsigned_char>_>::destruct);
  return pAVar1;
}

Assistant:

T* HeapArrayDisposer::allocate(size_t count) {
  if constexpr (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(sizeof(T), count, count, nullptr, nullptr));
  } else if (KJ_HAS_NOTHROW_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, nullptr));
  } else {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, &Dispose_<T>::destruct));
  }
}